

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O3

string * duckdb::GetSQLValueFunctionName(string *__return_storage_ptr__,string *column_name)

{
  int iVar1;
  string lcase;
  string local_30;
  
  StringUtil::Lower(&local_30,column_name);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"current_catalog","");
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"current_date","");
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
      if (iVar1 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"current_schema","");
      }
      else {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
        if (iVar1 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"current_role","");
        }
        else {
          iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
          if (iVar1 == 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"get_current_time","");
          }
          else {
            iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
            if (iVar1 == 0) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"get_current_timestamp","");
            }
            else {
              iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
              if (iVar1 == 0) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)__return_storage_ptr__,"current_user","");
              }
              else {
                iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
                if (iVar1 == 0) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,"current_localtime","");
                }
                else {
                  iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
                  if (iVar1 == 0) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,"current_localtimestamp","");
                  }
                  else {
                    iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
                    if (iVar1 == 0) {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,"session_user","");
                    }
                    else {
                      iVar1 = ::std::__cxx11::string::compare((char *)&local_30);
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      if (iVar1 == 0) {
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,"user","");
                      }
                      else {
                        __return_storage_ptr__->_M_string_length = 0;
                        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetSQLValueFunctionName(const string &column_name) {
	auto lcase = StringUtil::Lower(column_name);
	if (lcase == "current_catalog") {
		return "current_catalog";
	} else if (lcase == "current_date") {
		return "current_date";
	} else if (lcase == "current_schema") {
		return "current_schema";
	} else if (lcase == "current_role") {
		return "current_role";
	} else if (lcase == "current_time") {
		return "get_current_time";
	} else if (lcase == "current_timestamp") {
		return "get_current_timestamp";
	} else if (lcase == "current_user") {
		return "current_user";
	} else if (lcase == "localtime") {
		return "current_localtime";
	} else if (lcase == "localtimestamp") {
		return "current_localtimestamp";
	} else if (lcase == "session_user") {
		return "session_user";
	} else if (lcase == "user") {
		return "user";
	}
	return string();
}